

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O2

float __thiscall
ggx::evaluate(ggx *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_40;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_30;
  
  fVar1 = 0.0;
  if ((view_dir->field_0).field_0.z <= 0.0) {
    *probability_density_function = 0.0;
  }
  else {
    fVar1 = calculate_shadow_masking_term(this,light_dir,view_dir);
    local_40.field_0 =
         (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
          )glm::operator+(view_dir,light_dir);
    local_30.field_0 =
         (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
          )glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                     ((vec<3,_float,_(glm::precision)0> *)&local_40.field_0);
    fVar4 = local_30._8_4_;
    fVar2 = calculateNDF(this,(vec3 *)&local_30.field_0);
    fVar3 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::precision)0>,_float,_false>::call
                      (view_dir,(vec<3,_float,_(glm::precision)0> *)&local_30.field_0);
    *probability_density_function = ABS((fVar4 * fVar2 * 0.25) / fVar3);
    fVar1 = (fVar1 * fVar2 * 0.25) / (view_dir->field_0).field_0.z;
  }
  return fVar1;
}

Assistant:

float ggx::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  if (view_dir.z <= 0)
  {
    probability_density_function = 0;
    return 0;
  }

  float g2 = calculate_shadow_masking_term(light_dir, view_dir);

  const glm::vec3 h = glm::normalize(view_dir + light_dir);
  float ndf = calculateNDF(h);

  // Additional factor in the pdf (1/(4 dot(v,h))) is explained here:
  // - Microfacet Models for Refraction through Rough Surfaces
  // - Notes on the Ward BRDF, Bruce Walter
  probability_density_function = fabsf(ndf * h.z / 4.0f / glm::dot(view_dir, h));

  // We assume that Fresnel factor is equal to 1.
  float res = ndf * g2 / 4.0f / view_dir.z;

  return res;
}